

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_seqimap(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  csubstr s;
  bool bVar3;
  error_flags eVar4;
  NodeData *pNVar5;
  char *__filename;
  NodeScalar *__src;
  Parser *in_RDI;
  NodeScalar tmp;
  NodeType ty;
  size_t prev;
  char msg [35];
  undefined1 in_stack_00000247;
  Parser *in_stack_00000248;
  undefined4 in_stack_fffffffffffffee8;
  flag_t in_stack_fffffffffffffeec;
  Parser *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  Location *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  Tree *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  undefined8 local_a8;
  char *local_a0;
  size_t local_98;
  undefined8 local_80;
  Parser *pPStack_78;
  undefined8 local_70;
  undefined7 uStack_68;
  undefined1 in_stack_ffffffffffffff9f;
  Parser *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  Parser *in_stack_ffffffffffffffb0;
  
  bVar3 = has_all(in_RDI,0x18);
  if (!bVar3) {
    memcpy(&stack0xffffffffffffffa8,"check failed: (has_all(RSEQ|FLOW))",0x23);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
                       ,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0);
    LVar2.name.str._7_1_ = in_stack_ffffffffffffff9f;
    LVar2.name.str._0_7_ = uStack_68;
    in_stack_fffffffffffffee8 = (undefined4)local_80;
    in_stack_fffffffffffffeec = (flag_t)((ulong)local_80 >> 0x20);
    LVar2.super_LineCol.line = (size_t)pPStack_78;
    LVar2.super_LineCol.offset = local_80;
    LVar2.super_LineCol.col = local_70;
    LVar2.name.len = (size_t)in_stack_ffffffffffffffa0;
    (*p_Var1)(&stack0xffffffffffffffa8,0x23,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffef0 = pPStack_78;
  }
  bVar3 = Tree::has_children((Tree *)in_stack_fffffffffffffef0,
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (bVar3) {
    Tree::last_child((Tree *)in_stack_fffffffffffffef0,
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    pNVar5 = Tree::_p((Tree *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (((pNVar5->m_type).type & VAL) != NOTYPE) {
      __filename = (char *)Tree::last_child((Tree *)in_stack_fffffffffffffef0,
                                            CONCAT44(in_stack_fffffffffffffeec,
                                                     in_stack_fffffffffffffee8));
      Tree::_p((Tree *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      __src = Tree::valsc(in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
      memcpy(&stack0xffffffffffffff40,__src,0x30);
      Tree::remove(in_RDI->m_tree,__filename);
      _push_level(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
      _start_map(in_stack_00000248,(bool)in_stack_00000247);
      s.len = in_stack_ffffffffffffff50;
      s.str = (char *)in_stack_ffffffffffffff48;
      _store_scalar(in_stack_ffffffffffffff40,s,(flag_t)((ulong)local_a8 >> 0x20));
      (in_RDI->m_key_anchor).str = local_a0;
      (in_RDI->m_key_anchor).len = local_98;
      (in_RDI->m_key_tag).str = (char *)in_stack_ffffffffffffff40;
      (in_RDI->m_key_tag).len = (size_t)in_stack_ffffffffffffff48;
      goto LAB_003acaa0;
    }
  }
  _push_level(in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  _start_map(in_stack_00000248,(bool)in_stack_00000247);
  _store_scalar_null(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_003acaa0:
  add_flags(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  return;
}

Assistant:

void Parser::_start_seqimap()
{
    _c4dbgpf("start_seqimap at node={}. has_children={}", m_state->node_id, m_tree->has_children(m_state->node_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));
    // create a map, and turn the last scalar of this sequence
    // into the key of the map's first child. This scalar was
    // understood to be a value in the sequence, but it is
    // actually a key of a map, implicitly opened here.
    // Eg [val, key: val]
    //
    // Yep, YAML is crazy.
    if(m_tree->has_children(m_state->node_id) && m_tree->has_val(m_tree->last_child(m_state->node_id)))
    {
        size_t prev = m_tree->last_child(m_state->node_id);
        NodeType ty = m_tree->_p(prev)->m_type; // don't use type() because it masks out the quotes
        NodeScalar tmp = m_tree->valsc(prev);
        _c4dbgpf("has children and last child={} has val. saving the scalars, val='{}' quoted={}", prev, tmp.scalar, ty.is_val_quoted());
        m_tree->remove(prev);
        _push_level();
        _start_map();
        _store_scalar(tmp.scalar, ty.is_val_quoted());
        m_key_anchor = tmp.anchor;
        m_key_tag = tmp.tag;
    }
    else
    {
        _c4dbgpf("node {} has no children yet, using empty key", m_state->node_id);
        _push_level();
        _start_map();
        _store_scalar_null(m_state->line_contents.rem.str);
    }
    add_flags(RSEQIMAP|FLOW);
}